

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O0

int wally_confidential_addr_to_addr_segwit
              (char *address,char *confidential_addr_family,char *addr_family,char **output)

{
  int iVar1;
  int local_434;
  size_t sStack_430;
  int ret;
  size_t written;
  uchar *puStack_420;
  int witver;
  uchar *hash_bytes_p;
  uchar buf [1000];
  char **output_local;
  char *addr_family_local;
  char *confidential_addr_family_local;
  char *address_local;
  
  puStack_420 = buf + 0x17;
  written._4_4_ = 0;
  sStack_430 = 0;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((address == (char *)0x0) || (output == (char **)0x0)) {
    address_local._4_4_ = -2;
  }
  else {
    buf._992_8_ = output;
    iVar1 = blech32_addr_decode((int *)((long)&written + 4),(uint8_t *)&hash_bytes_p,
                                &stack0xfffffffffffffbd0,confidential_addr_family,address);
    if (iVar1 == 0) {
      local_434 = -2;
    }
    else if ((written._4_4_ == 0) && ((sStack_430 == 0x35 || (sStack_430 == 0x41)))) {
      sStack_430 = sStack_430 - 0x1f;
      *puStack_420 = '\0';
      puStack_420[1] = (char)sStack_430 + 0xfe;
      local_434 = wally_addr_segwit_from_bytes
                            (puStack_420,sStack_430,addr_family,0,(char **)buf._992_8_);
    }
    else {
      local_434 = -2;
    }
    wally_clear(&hash_bytes_p,1000);
    address_local._4_4_ = local_434;
  }
  return address_local._4_4_;
}

Assistant:

int wally_confidential_addr_to_addr_segwit(
    const char *address,
    const char *confidential_addr_family,
    const char *addr_family,
    char **output)
{
    unsigned char buf[WALLY_BLECH32_MAXLEN];
    unsigned char *hash_bytes_p = &buf[EC_PUBLIC_KEY_LEN - 2];
    int witver = 0;
    size_t written = 0;
    int ret;

    if (output)
        *output = NULL;

    if (!address || !output)
        return WALLY_EINVAL;

    if (!blech32_addr_decode(&witver, buf, &written, confidential_addr_family, address))
        ret = WALLY_EINVAL;
    else if (witver != 0 || (written != 53 && written != 65))
        ret = WALLY_EINVAL;    /* Only v0 witness programs are currently allowed */
    else {
        written = written - EC_PUBLIC_KEY_LEN + 2;
        hash_bytes_p[0] = (unsigned char) witver;
        hash_bytes_p[1] = (unsigned char) (written - 2);
        ret = wally_addr_segwit_from_bytes(hash_bytes_p, written,
                                           addr_family, 0, output);
    }

    wally_clear(buf, sizeof(buf));
    return ret;
}